

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hbox.cpp
# Opt level: O0

void __thiscall ftxui::HBox::SetBox(HBox *this,Box box)

{
  bool bVar1;
  vector<std::unique_ptr<ftxui::Node,_std::default_delete<ftxui::Node>_>,_std::allocator<std::unique_ptr<ftxui::Node,_std::default_delete<ftxui::Node>_>_>_>
  *pvVar2;
  pointer pNVar3;
  int *piVar4;
  bool local_171;
  Requirement local_154;
  Requirement local_130;
  int local_10c;
  int added_space;
  int local_100;
  Requirement local_e4;
  undefined8 local_c0;
  Box child_box;
  unique_ptr<ftxui::Node,_std::default_delete<ftxui::Node>_> *child_1;
  iterator __end2_1;
  iterator __begin2_1;
  vector<std::unique_ptr<ftxui::Node,_std::default_delete<ftxui::Node>_>,_std::allocator<std::unique_ptr<ftxui::Node,_std::default_delete<ftxui::Node>_>_>_>
  *__range2_1;
  int x;
  int remaining_extra_space;
  int remaining_flex;
  int extra_space;
  int space;
  int local_74;
  reference local_58;
  unique_ptr<ftxui::Node,_std::default_delete<ftxui::Node>_> *child;
  iterator __end2;
  iterator __begin2;
  vector<std::unique_ptr<ftxui::Node,_std::default_delete<ftxui::Node>_>,_std::allocator<std::unique_ptr<ftxui::Node,_std::default_delete<ftxui::Node>_>_>_>
  *__range2;
  int flex_sum;
  HBox *this_local;
  Box box_local;
  
  box_local._0_8_ = box._8_8_;
  this_local = box._0_8_;
  Node::SetBox(&this->super_Node,box);
  __range2._4_4_ = 0;
  pvVar2 = &(this->super_Node).children;
  __end2 = std::
           vector<std::unique_ptr<ftxui::Node,_std::default_delete<ftxui::Node>_>,_std::allocator<std::unique_ptr<ftxui::Node,_std::default_delete<ftxui::Node>_>_>_>
           ::begin(pvVar2);
  child = (unique_ptr<ftxui::Node,_std::default_delete<ftxui::Node>_> *)
          std::
          vector<std::unique_ptr<ftxui::Node,_std::default_delete<ftxui::Node>_>,_std::allocator<std::unique_ptr<ftxui::Node,_std::default_delete<ftxui::Node>_>_>_>
          ::end(pvVar2);
  while (bVar1 = __gnu_cxx::operator!=
                           (&__end2,(__normal_iterator<std::unique_ptr<ftxui::Node,_std::default_delete<ftxui::Node>_>_*,_std::vector<std::unique_ptr<ftxui::Node,_std::default_delete<ftxui::Node>_>,_std::allocator<std::unique_ptr<ftxui::Node,_std::default_delete<ftxui::Node>_>_>_>_>
                                     *)&child), bVar1) {
    local_58 = __gnu_cxx::
               __normal_iterator<std::unique_ptr<ftxui::Node,_std::default_delete<ftxui::Node>_>_*,_std::vector<std::unique_ptr<ftxui::Node,_std::default_delete<ftxui::Node>_>,_std::allocator<std::unique_ptr<ftxui::Node,_std::default_delete<ftxui::Node>_>_>_>_>
               ::operator*(&__end2);
    pNVar3 = std::unique_ptr<ftxui::Node,_std::default_delete<ftxui::Node>_>::operator->(local_58);
    Node::requirement((Requirement *)&extra_space,pNVar3);
    __range2._4_4_ = local_74 + __range2._4_4_;
    __gnu_cxx::
    __normal_iterator<std::unique_ptr<ftxui::Node,_std::default_delete<ftxui::Node>_>_*,_std::vector<std::unique_ptr<ftxui::Node,_std::default_delete<ftxui::Node>_>,_std::allocator<std::unique_ptr<ftxui::Node,_std::default_delete<ftxui::Node>_>_>_>_>
    ::operator++(&__end2);
  }
  __range2_1._4_4_ =
       ((this_local._4_4_ - (int)this_local) + 1) - (this->super_Node).requirement_.min.x;
  x = __range2._4_4_;
  __range2_1._0_4_ = (int)this_local;
  pvVar2 = &(this->super_Node).children;
  __end2_1 = std::
             vector<std::unique_ptr<ftxui::Node,_std::default_delete<ftxui::Node>_>,_std::allocator<std::unique_ptr<ftxui::Node,_std::default_delete<ftxui::Node>_>_>_>
             ::begin(pvVar2);
  child_1 = (unique_ptr<ftxui::Node,_std::default_delete<ftxui::Node>_> *)
            std::
            vector<std::unique_ptr<ftxui::Node,_std::default_delete<ftxui::Node>_>,_std::allocator<std::unique_ptr<ftxui::Node,_std::default_delete<ftxui::Node>_>_>_>
            ::end(pvVar2);
  while (bVar1 = __gnu_cxx::operator!=
                           (&__end2_1,
                            (__normal_iterator<std::unique_ptr<ftxui::Node,_std::default_delete<ftxui::Node>_>_*,_std::vector<std::unique_ptr<ftxui::Node,_std::default_delete<ftxui::Node>_>,_std::allocator<std::unique_ptr<ftxui::Node,_std::default_delete<ftxui::Node>_>_>_>_>
                             *)&child_1), bVar1) {
    child_box._8_8_ =
         __gnu_cxx::
         __normal_iterator<std::unique_ptr<ftxui::Node,_std::default_delete<ftxui::Node>_>_*,_std::vector<std::unique_ptr<ftxui::Node,_std::default_delete<ftxui::Node>_>,_std::allocator<std::unique_ptr<ftxui::Node,_std::default_delete<ftxui::Node>_>_>_>_>
         ::operator*(&__end2_1);
    child_box.x_min = box_local.x_min;
    child_box.x_max = box_local.x_max;
    local_c0._4_4_ = (int)((ulong)this_local >> 0x20);
    local_c0 = CONCAT44(local_c0._4_4_,(int)__range2_1);
    pNVar3 = std::unique_ptr<ftxui::Node,_std::default_delete<ftxui::Node>_>::operator->
                       ((unique_ptr<ftxui::Node,_std::default_delete<ftxui::Node>_> *)
                        child_box._8_8_);
    Node::requirement(&local_e4,pNVar3);
    local_c0._4_4_ = (int)__range2_1 + local_e4.min.x + -1;
    pNVar3 = std::unique_ptr<ftxui::Node,_std::default_delete<ftxui::Node>_>::operator->
                       ((unique_ptr<ftxui::Node,_std::default_delete<ftxui::Node>_> *)
                        child_box._8_8_);
    Node::requirement((Requirement *)&stack0xfffffffffffffef8,pNVar3);
    local_171 = local_100 != 0 && 0 < __range2_1._4_4_;
    if (local_171) {
      pNVar3 = std::unique_ptr<ftxui::Node,_std::default_delete<ftxui::Node>_>::operator->
                         ((unique_ptr<ftxui::Node,_std::default_delete<ftxui::Node>_> *)
                          child_box._8_8_);
      Node::requirement(&local_130,pNVar3);
      local_10c = (__range2_1._4_4_ * local_130.flex.x) / x;
      __range2_1._4_4_ = __range2_1._4_4_ - local_10c;
      pNVar3 = std::unique_ptr<ftxui::Node,_std::default_delete<ftxui::Node>_>::operator->
                         ((unique_ptr<ftxui::Node,_std::default_delete<ftxui::Node>_> *)
                          child_box._8_8_);
      Node::requirement(&local_154,pNVar3);
      x = x - local_154.flex.x;
      local_c0._4_4_ = local_10c + local_c0._4_4_;
    }
    piVar4 = std::min<int>((int *)((long)&local_c0 + 4),(int *)((long)&this_local + 4));
    local_c0 = CONCAT44(*piVar4,(undefined4)local_c0);
    pNVar3 = std::unique_ptr<ftxui::Node,_std::default_delete<ftxui::Node>_>::operator->
                       ((unique_ptr<ftxui::Node,_std::default_delete<ftxui::Node>_> *)
                        child_box._8_8_);
    (*pNVar3->_vptr_Node[3])(pNVar3,local_c0,child_box._0_8_);
    __range2_1._0_4_ = local_c0._4_4_ + 1;
    __gnu_cxx::
    __normal_iterator<std::unique_ptr<ftxui::Node,_std::default_delete<ftxui::Node>_>_*,_std::vector<std::unique_ptr<ftxui::Node,_std::default_delete<ftxui::Node>_>,_std::allocator<std::unique_ptr<ftxui::Node,_std::default_delete<ftxui::Node>_>_>_>_>
    ::operator++(&__end2_1);
  }
  return;
}

Assistant:

void SetBox(Box box) override {
    Node::SetBox(box);

    int flex_sum = 0;
    for (auto& child : children)
      flex_sum += child->requirement().flex.x;

    int space = box.x_max - box.x_min + 1;
    int extra_space = space - requirement_.min.x;

    int remaining_flex = flex_sum;
    int remaining_extra_space = extra_space;

    int x = box.x_min;
    for (auto& child : children) {
      Box child_box = box;
      child_box.x_min = x;

      child_box.x_max = x + child->requirement().min.x - 1;

      if (child->requirement().flex.x && remaining_extra_space > 0) {
        int added_space = remaining_extra_space * child->requirement().flex.x /
                          remaining_flex;
        remaining_extra_space -= added_space;
        remaining_flex -= child->requirement().flex.x;
        child_box.x_max += added_space;
      }
      child_box.x_max = std::min(child_box.x_max, box.x_max);

      child->SetBox(child_box);
      x = child_box.x_max + 1;
    }
  }